

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextmarkdownwriter_p.h
# Opt level: O0

void __thiscall QTextMarkdownWriter::~QTextMarkdownWriter(QTextMarkdownWriter *this)

{
  QString::~QString((QString *)0x7c1ac0);
  QString::~QString((QString *)0x7c1ace);
  QMap<QTextList_*,_QTextMarkdownWriter::ListInfo>::~QMap
            ((QMap<QTextList_*,_QTextMarkdownWriter::ListInfo> *)0x7c1adc);
  return;
}

Assistant:

class Q_GUI_EXPORT QTextMarkdownWriter
{
public:
    QTextMarkdownWriter(QTextStream &stream, QTextDocument::MarkdownFeatures features);
    bool writeAll(const QTextDocument *document);
#if QT_CONFIG(itemmodel)
    void writeTable(const QAbstractItemModel *table);
#endif

    int writeBlock(const QTextBlock &block, bool table, bool ignoreFormat, bool ignoreEmpty);
    void writeFrame(const QTextFrame *frame);
    void writeFrontMatter(const QString &fm);

private:
    struct ListInfo {
        bool loose;
    };

    ListInfo listInfo(QTextList *list);
    void setLinePrefixForBlockQuote(int level);

private:
    QTextStream &m_stream;
    QTextDocument::MarkdownFeatures m_features;
    QMap<QTextList *, ListInfo> m_listInfo;
    QString m_linePrefix;
    QString m_codeBlockFence;
    int m_wrappedLineIndent = 0;
    int m_lastListIndent = 1;
    bool m_doubleNewlineWritten = false;
    bool m_linePrefixWritten = false;
    bool m_indentedCodeBlock = false;
    bool m_fencedCodeBlock = false;
}